

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_iterator.cpp
# Opt level: O0

vector<long,_std::allocator<long>_> *
random_numbers(vector<long,_std::allocator<long>_> *__return_storage_ptr__,size_t size)

{
  anon_class_16_2_a39a3d48 __gen;
  iterator __first;
  undefined1 local_48 [8];
  uniform_int_distribution<long> uniform;
  default_random_engine generator;
  allocator<long> local_1a;
  undefined1 local_19;
  size_t local_18;
  size_t size_local;
  vector<long,_std::allocator<long>_> *numbers;
  
  local_19 = 0;
  local_18 = size;
  size_local = (size_t)__return_storage_ptr__;
  std::allocator<long>::allocator(&local_1a);
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__,size,&local_1a);
  std::allocator<long>::~allocator(&local_1a);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &uniform._M_param._M_b);
  std::uniform_int_distribution<long>::uniform_int_distribution
            ((uniform_int_distribution<long> *)local_48);
  __first = std::vector<long,_std::allocator<long>_>::begin(__return_storage_ptr__);
  __gen.generator = (default_random_engine *)&uniform._M_param._M_b;
  __gen.uniform = (uniform_int_distribution<long> *)local_48;
  std::
  generate_n<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,unsigned_long,random_numbers(unsigned_long)::__0>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
             __first._M_current,local_18,__gen);
  return __return_storage_ptr__;
}

Assistant:

auto random_numbers (std::size_t size)
{
    std::vector<std::int64_t> numbers(size);

    std::default_random_engine generator;
    std::uniform_int_distribution<std::int64_t> uniform;
    std::generate_n(numbers.begin(), size,
        [& uniform, & generator] {return uniform(generator);});

    return numbers;
}